

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O0

int __thiscall
OpenMD::LegendreCorrFuncZ::computeProperty1(LegendreCorrFuncZ *this,int frame,StuntDouble *sd)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  int in_ESI;
  long in_RDI;
  value_type_conflict2 *__x;
  int zBin;
  Vector3d pos;
  RotMat3x3d A;
  StuntDouble *in_stack_ffffffffffffff38;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *this_01;
  Vector<double,_3U> local_88 [2];
  Vector3d *in_stack_ffffffffffffffa8;
  Snapshot *in_stack_ffffffffffffffb0;
  
  StuntDouble::getA(in_stack_ffffffffffffff38);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                *)(in_RDI + 0xeb8),(long)in_ESI);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
  StuntDouble::getPos(in_stack_ffffffffffffff38);
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x98));
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x16c130);
  if (bVar1) {
    Snapshot::wrapVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  __x = (value_type_conflict2 *)(double)*(uint *)(in_RDI + 0xe70);
  this_01 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 0xe80);
  Vector<double,_3U>::operator[](local_88,*(uint *)(in_RDI + 0xe88));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(in_RDI + 0xf00),(long)in_ESI);
  std::vector<int,_std::allocator<int>_>::push_back(this_01,__x);
  this_00 = std::
            vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                          *)(in_RDI + 0xeb8),(long)in_ESI);
  sVar2 = std::
          vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
          size(this_00);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16c23e);
  return (int)sVar2 + -1;
}

Assistant:

int LegendreCorrFuncZ::computeProperty1(int frame, StuntDouble* sd) {
    RotMat3x3d A = sd->getA();
    rotMats_[frame].push_back(A);

    Vector3d pos = sd->getPos();
    if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
      currentSnapshot_->wrapVector(pos);
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / boxZ_);
    zbin_[frame].push_back(zBin);

    return rotMats_[frame].size() - 1;
  }